

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUtils.h
# Opt level: O3

void __thiscall
phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>::plot
          (TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *this,
          ofstream *OS)

{
  _Base_ptr p_Var1;
  EdgeMap *pEVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *Succ;
  _Base_ptr p_Var6;
  EdgeMap *__range2;
  string local_78;
  string local_58;
  TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID> *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)OS,"digraph <",9);
  poVar3 = std::ostream::_M_insert<void_const*>(OS);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"> {\n",4);
  local_38 = this;
  for (p_Var4 = (this->Nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->Nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)OS,"\"",1);
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_
              (&local_78,(AddressID<phaeton::ExpressionNode> *)(p_Var4 + 1));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)OS,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," [label=\"",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)p_Var4[1]._M_parent,(long)p_Var4[1]._M_left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"];\n",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  pEVar2 = &local_38->Edges;
  for (p_Var4 = (local_38->Edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pEVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var1 = (p_Var4[3]._M_left)->_M_parent;
    p_Var6 = (p_Var4[3]._M_left)->_M_right;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)OS,"\"",1);
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_
              (&local_78,(AddressID<phaeton::ExpressionNode> *)&p_Var1->_M_parent);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)OS,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" -> \"",6);
    AddressID<phaeton::ExpressionNode>::str_abi_cxx11_
              (&local_58,(AddressID<phaeton::ExpressionNode> *)&p_Var6->_M_parent);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," [label=\"",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)p_Var4[1]._M_parent,(long)p_Var4[1]._M_left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"];\n",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  p_Var1 = (local_38->Nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[2]._M_right;
  do {
    p_Var6 = p_Var1;
    p_Var1 = *(_Base_ptr *)(p_Var6 + 3);
  } while (*(_Base_ptr *)(p_Var6 + 3) != (_Base_ptr)0x0);
  if (p_Var6[3]._M_parent != (_Base_ptr)0x0) {
    p_Var1 = p_Var6[3]._M_parent;
    do {
      p_Var5 = p_Var1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)OS,"\"",1);
      AddressID<phaeton::ExpressionNode>::str_abi_cxx11_
                (&local_78,(AddressID<phaeton::ExpressionNode> *)&p_Var6->_M_parent);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)OS,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" -> \"",6);
      AddressID<phaeton::ExpressionNode>::str_abi_cxx11_
                (&local_58,(AddressID<phaeton::ExpressionNode> *)&p_Var5->_M_parent);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [style=dashed];\n",0x11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      p_Var1 = p_Var5[3]._M_parent;
      p_Var6 = p_Var5;
    } while (p_Var5[3]._M_parent != (_Base_ptr)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)OS,"}\n",2);
  return;
}

Assistant:

void TensorGraph<NodeID, EdgeID>::plot(std::ofstream &OS) const {
  OS << "digraph <" << this << "> {\n";

  for (const auto &N : Nodes) {
    const NodeID &Id = N.first;
    OS << "\"" << Id.str() << "\""
       << " [label=\"" << Id.getLabel() << "\"];\n";
  }

  for (const auto &E : Edges) {
    const EdgeID &Id = E.first;
    const NodeID &Src = E.second->getSrcNode()->getID();
    const NodeID &Target = E.second->getTargetNode()->getID();

    OS << "\"" << Src.str() << "\" -> \"" << Target.str() << "\""
       << " [label=\"" << Id.getLabel() << "\"];\n";
  }

  const GraphNode<NodeID, EdgeID> *N = getStartNode();
  while (N->hasSucc()) {
    const GraphNode<NodeID, EdgeID> *Succ = N->getSucc();
    const NodeID &NId = N->getID();
    const NodeID &SuccId = Succ->getID();

    OS << "\"" << NId.str() << "\" -> \"" << SuccId.str() << "\""
       << " [style=dashed];\n";

    N = Succ;
  }

  OS << "}\n";
}